

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  int *par_close_flag;
  LYS_NODE LVar1;
  uint uVar2;
  lys_node *__s;
  long lVar3;
  char *__s_00;
  long lVar4;
  long lVar5;
  lyout *plVar6;
  lyout *plVar7;
  ushort uVar8;
  int iVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  char *pcVar12;
  lys_node **pplVar13;
  lys_module *plVar14;
  lys_module *plVar15;
  LYS_NODE LVar16;
  char *pcVar17;
  int iVar18;
  char *pcVar19;
  lys_node **pplVar20;
  lys_ext_instance **pplVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int local_4c;
  lyout *plStack_48;
  int content_4;
  lys_node *local_40;
  lys_node_inout *inout;
  int content;
  
  LVar1 = node->nodetype;
  LVar16 = mask & LVar1;
  plStack_48 = out;
  local_40 = node;
  switch(LVar16) {
  case LYS_CONTAINER:
    inout._4_4_ = 0;
    yin_print_open(out,level,(char *)0x0,"container","name",node->name,0);
    iVar9 = level + 1;
    yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),1);
    if (node[1].name != (char *)0x0) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_when(out,iVar9,node->module,(lys_when *)node[1].name);
    }
    lVar24 = 0;
    for (uVar22 = 0; uVar22 < node->iffeature_size; uVar22 = uVar22 + 1) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_iffeature(out,iVar9,node->module,
                          (lys_iffeature *)((long)&node->iffeature->expr + lVar24));
      lVar24 = lVar24 + 0x20;
    }
    lVar24 = 0;
    for (uVar22 = 0; uVar22 < node->padding[1]; uVar22 = uVar22 + 1) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_must(out,iVar9,local_40->module,(lys_restr *)(local_40[1].dsc + lVar24));
      lVar24 = lVar24 + 0x38;
      node = local_40;
    }
    lVar3._0_2_ = node[1].flags;
    lVar3._2_1_ = node[1].ext_size;
    lVar3._3_1_ = node[1].iffeature_size;
    lVar3._4_1_ = node[1].padding[0];
    lVar3._5_1_ = node[1].padding[1];
    lVar3._6_1_ = node[1].padding[2];
    lVar3._7_1_ = node[1].padding[3];
    if (lVar3 != 0) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_PRESENCE,'\0',*(char **)&local_40[1].flags,
                        local_40->module,local_40->ext,(uint)local_40->ext_size);
      node = local_40;
    }
    yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),0x74);
    lVar24 = 0;
    for (uVar22 = 0; plVar6 = plStack_48, uVar22 < *(ushort *)(node->padding + 2);
        uVar22 = uVar22 + 1) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_typedef(out,iVar9,node->module,(lys_tpdf *)(node[1].ref + lVar24));
      lVar24 = lVar24 + 0x80;
    }
    pplVar20 = &node->child;
    pplVar13 = pplVar20;
    while (plVar7 = plStack_48, plVar10 = *pplVar13, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == node) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_snode(plVar6,iVar9,plVar10,0x800);
        node = local_40;
      }
      pplVar13 = &plVar10->next;
    }
    pplVar13 = pplVar20;
    while (plVar6 = plStack_48, plVar10 = *pplVar13, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == node) {
        yin_print_close_parent(plVar7,(int *)((long)&inout + 4));
        yin_print_snode(plVar7,iVar9,plVar10,0x903f);
        node = local_40;
      }
      pplVar13 = &plVar10->next;
    }
    pplVar13 = pplVar20;
    while (out = plStack_48, plVar10 = *pplVar13, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == node) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_snode(plVar6,iVar9,plVar10,0x4000);
        node = local_40;
      }
      pplVar13 = &plVar10->next;
    }
    while (plVar10 = *pplVar20, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == node) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_snode(out,iVar9,plVar10,0x80);
        node = local_40;
      }
      pplVar20 = &plVar10->next;
    }
    pcVar17 = "container";
    iVar9 = inout._4_4_;
    break;
  case LYS_CHOICE:
    inout._4_4_ = 0;
    yin_print_open(out,level,(char *)0x0,"choice","name",node->name,0);
    iVar9 = level + 1;
    yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),1);
    lVar4._0_1_ = node->hash[0];
    lVar4._1_1_ = node->hash[1];
    lVar4._2_1_ = node->hash[2];
    lVar4._3_1_ = node->hash[3];
    lVar4._4_4_ = *(undefined4 *)&node->field_0x6c;
    if (lVar4 != 0) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_when(out,iVar9,node->module,*(lys_when **)node->hash);
    }
    lVar24 = 0;
    for (uVar22 = 0; uVar22 < node->iffeature_size; uVar22 = uVar22 + 1) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_iffeature(out,iVar9,node->module,
                          (lys_iffeature *)((long)&node->iffeature->expr + lVar24));
      lVar24 = lVar24 + 0x20;
    }
    if (node[1].name != (char *)0x0) {
      yin_print_close_parent(out,(int *)((long)&inout + 4));
      yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)local_40[1].name,
                        local_40->module,local_40->ext,(uint)local_40->ext_size);
      node = local_40;
    }
    yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),0x7c);
    pplVar20 = &local_40->child;
    plVar10 = local_40;
    while (plVar11 = *pplVar20, plVar11 != (lys_node *)0x0) {
      if (plVar11->parent == plVar10) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_snode(out,iVar9,plVar11,0x807f);
        plVar10 = local_40;
      }
      pplVar20 = &plVar11->next;
    }
    pcVar17 = "choice";
    iVar9 = inout._4_4_;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_00183988_caseD_3;
  case LYS_LEAF:
    yin_print_open(out,level,(char *)0x0,"leaf","name",node->name,1);
    iVar9 = level + 1;
    yin_print_snode_common(out,iVar9,local_40,local_40->module,(int *)0x0,1);
    if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
      yin_print_when(out,iVar9,local_40->module,(lys_when *)local_40[1].name);
    }
    lVar24 = 0;
    for (uVar22 = 0; plVar10 = local_40, uVar22 < local_40->iffeature_size; uVar22 = uVar22 + 1) {
      yin_print_iffeature(out,iVar9,local_40->module,
                          (lys_iffeature *)((long)&local_40->iffeature->expr + lVar24));
      lVar24 = lVar24 + 0x20;
    }
    yin_print_type(out,iVar9,local_40->module,(lys_type *)&local_40[1].ref);
    lVar24 = 0;
    yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_UNITS,'\0',(char *)plVar10[1].next,plVar10->module,
                      plVar10->ext,(uint)plVar10->ext_size);
    for (uVar22 = 0; uVar22 < plVar10->padding[3]; uVar22 = uVar22 + 1) {
      yin_print_must(out,iVar9,plVar10->module,(lys_restr *)(plVar10[1].dsc + lVar24));
      lVar24 = lVar24 + 0x38;
    }
    plVar11 = plVar10[1].prev;
    if (plVar11 != (lys_node *)0x0) {
      if ((plVar10->flags & 0x1000) != 0) {
        pcVar17 = strchr((char *)plVar11,0x3a);
        plVar10 = local_40;
        if (pcVar17 == (char *)0x0) {
          __assert_fail("strchr(leaf->dflt, \':\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                        ,0x45f,"void yin_print_leaf(struct lyout *, int, const struct lys_node *)");
        }
        plVar14 = lys_node_module(local_40);
        pcVar17 = plVar14->name;
        __s = plVar10[1].prev;
        pcVar19 = strchr((char *)__s,0x3a);
        iVar18 = strncmp((char *)plVar11,pcVar17,(long)pcVar19 - (long)__s);
        plVar14 = plVar10->module;
        if (iVar18 == 0) {
          plVar11 = (lys_node *)lydict_insert(plVar14->ctx,pcVar19 + 1,0);
          plVar10 = local_40;
          out = plStack_48;
        }
        else {
          plVar11 = (lys_node *)transform_json2schema(plVar14,(char *)__s);
          plVar10 = local_40;
          out = plStack_48;
        }
      }
      yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar11,plVar10->module,
                        plVar10->ext,(uint)plVar10->ext_size);
      plVar10 = local_40;
      if ((local_40->flags & 0x1000) != 0) {
        lydict_remove(local_40->module->ctx,(char *)plVar11);
        plVar10 = local_40;
      }
    }
    yin_print_snode_common(out,iVar9,plVar10,plVar10->module,(int *)0x0,0x7c);
    pcVar19 = "leaf";
    goto LAB_0018537b;
  case LYS_LEAFLIST:
    yin_print_open(out,level,(char *)0x0,"leaf-list","name",node->name,1);
    iVar9 = level + 1;
    yin_print_snode_common(out,iVar9,local_40,local_40->module,(int *)0x0,1);
    if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
      yin_print_when(out,iVar9,local_40->module,(lys_when *)local_40[1].name);
    }
    lVar24 = 0;
    for (uVar22 = 0; plVar10 = local_40, uVar22 < local_40->iffeature_size; uVar22 = uVar22 + 1) {
      yin_print_iffeature(out,iVar9,local_40->module,
                          (lys_iffeature *)((long)&local_40->iffeature->expr + lVar24));
      lVar24 = lVar24 + 0x20;
    }
    yin_print_type(out,iVar9,local_40->module,(lys_type *)&local_40[1].ref);
    lVar24 = 0;
    yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_UNITS,'\0',(char *)plVar10[1].next,plVar10->module,
                      plVar10->ext,(uint)plVar10->ext_size);
    for (uVar22 = 0; uVar22 < plVar10->padding[3]; uVar22 = uVar22 + 1) {
      yin_print_must(out,iVar9,plVar10->module,(lys_restr *)(plVar10[1].dsc + lVar24));
      lVar24 = lVar24 + 0x38;
    }
    for (uVar22 = 0; uVar22 < plVar10->padding[2]; uVar22 = uVar22 + 1) {
      pcVar17 = *(char **)((plVar10[1].prev)->padding + uVar22 * 8 + -0x1c);
      if ((plVar10->flags & 0x1000) != 0) {
        pcVar19 = strchr(pcVar17,0x3a);
        plVar10 = local_40;
        if (pcVar19 == (char *)0x0) {
          __assert_fail("strchr(llist->dflt[i], \':\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                        ,0x4b3,
                        "void yin_print_leaflist(struct lyout *, int, const struct lys_node *)");
        }
        plVar14 = lys_node_module(local_40);
        pcVar19 = plVar14->name;
        __s_00 = *(char **)((plVar10[1].prev)->padding + uVar22 * 8 + -0x1c);
        pcVar12 = strchr(__s_00,0x3a);
        iVar18 = strncmp(pcVar17,pcVar19,(long)pcVar12 - (long)__s_00);
        plVar14 = plVar10->module;
        if (iVar18 == 0) {
          pcVar17 = lydict_insert(plVar14->ctx,pcVar12 + 1,0);
          plVar10 = local_40;
        }
        else {
          pcVar17 = transform_json2schema(plVar14,__s_00);
          plVar10 = local_40;
        }
      }
      yin_print_substmt(plStack_48,iVar9,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar22,pcVar17,
                        plVar10->module,plVar10->ext,(uint)plVar10->ext_size);
      if ((local_40->flags & 0x1000) != 0) {
        lydict_remove(local_40->module->ctx,pcVar17);
      }
      plVar10 = local_40;
      out = plStack_48;
    }
    yin_print_snode_common(out,iVar9,plVar10,plVar10->module,(int *)0x0,4);
    if (*(uint *)&local_40[1].priv != 0) {
      yin_print_unsigned(out,iVar9,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                         (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
    }
    uVar2 = *(uint *)((long)&local_40[1].priv + 4);
    if (uVar2 != 0) {
      yin_print_unsigned(out,iVar9,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                         (uint)local_40->ext_size,uVar2);
    }
    plVar10 = local_40;
    if ((local_40->flags & 0x100) == 0) {
      iVar18 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
      if (iVar18 != -1) {
        pcVar17 = "system";
        goto LAB_0018506c;
      }
    }
    else {
      pcVar17 = "user";
LAB_0018506c:
      yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar17,plVar10->module,plVar10->ext,
                        (uint)plVar10->ext_size);
    }
    yin_print_snode_common(out,iVar9,plVar10,plVar10->module,(int *)0x0,0x70);
    pcVar19 = "leaf-list";
LAB_0018537b:
    yin_print_close(out,level,(char *)0x0,pcVar19,1);
    return;
  default:
    if (LVar16 == LYS_LIST) {
      inout._4_4_ = 0;
      yin_print_open(out,level,(char *)0x0,"list","name",node->name,0);
      iVar9 = level + 1;
      yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),1);
      if (node[1].name != (char *)0x0) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_when(out,iVar9,node->module,(lys_when *)node[1].name);
      }
      lVar24 = 0;
      for (uVar22 = 0; uVar22 < node->iffeature_size; uVar22 = uVar22 + 1) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_iffeature(out,iVar9,node->module,
                            (lys_iffeature *)((long)&node->iffeature->expr + lVar24));
        lVar24 = lVar24 + 0x20;
      }
      lVar24 = 0;
      for (uVar22 = 0; uVar22 < node->padding[0]; uVar22 = uVar22 + 1) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_must(out,iVar9,local_40->module,(lys_restr *)(local_40[1].dsc + lVar24));
        lVar24 = lVar24 + 0x38;
        node = local_40;
      }
      if (node->padding[2] != '\0') {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_substmt(out,iVar9,LYEXT_SUBSTMT_KEY,'\0',(char *)node[1].module,node->module,
                          node->ext,(uint)node->ext_size);
      }
      for (uVar22 = 0; plVar6 = plStack_48, uVar22 < local_40->padding[3]; uVar22 = uVar22 + 1) {
        yin_print_close_parent(plStack_48,(int *)((long)&inout + 4));
        yin_print_unique(plVar6,iVar9,local_40->module,(lys_unique *)(local_40[1].ext + uVar22 * 2))
        ;
        plVar10 = local_40;
        local_4c = 0;
        pplVar21 = local_40->ext;
        iVar18 = -1;
        while (iVar18 = lys_ext_iter(pplVar21,plVar10->ext_size,(char)iVar18 + '\x01',
                                     LYEXT_SUBSTMT_UNIQUE), iVar18 != -1) {
          pplVar21 = plVar10->ext;
          if (uVar22 == pplVar21[iVar18]->insubstmt_index) {
            yin_print_close_parent(plStack_48,&local_4c);
            pplVar21 = local_40->ext;
            plVar10 = local_40;
            do {
              yin_print_extension_instances
                        (plStack_48,level + 2,plVar10->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar22,
                         pplVar21 + iVar18,1);
              plVar10 = local_40;
              pplVar21 = local_40->ext;
              do {
                iVar18 = lys_ext_iter(pplVar21,plVar10->ext_size,(char)iVar18 + '\x01',
                                      LYEXT_SUBSTMT_UNIQUE);
                if (iVar18 == -1) goto LAB_00184767;
                pplVar21 = plVar10->ext;
              } while (uVar22 != pplVar21[iVar18]->insubstmt_index);
            } while( true );
          }
        }
LAB_00184767:
        yin_print_close(plStack_48,iVar9,(char *)0x0,"unique",local_4c);
      }
      yin_print_snode_common(plStack_48,iVar9,local_40,local_40->module,(int *)((long)&inout + 4),4)
      ;
      if (*(int *)&local_40[1].iffeature != 0) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_unsigned(plVar6,iVar9,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,*(uint *)&local_40[1].iffeature);
      }
      if (*(int *)((long)&local_40[1].iffeature + 4) != 0) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_unsigned(plVar6,iVar9,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,*(uint *)((long)&local_40[1].iffeature + 4));
      }
      plVar10 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar18 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar18 != -1) {
          pcVar17 = "system";
          goto LAB_001850c6;
        }
      }
      else {
        pcVar17 = "user";
LAB_001850c6:
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        plVar10 = local_40;
        yin_print_substmt(plVar6,iVar9,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar17,local_40->module,
                          local_40->ext,(uint)local_40->ext_size);
      }
      yin_print_snode_common(plVar6,iVar9,plVar10,plVar10->module,(int *)((long)&inout + 4),0x70);
      lVar24 = 0;
      for (uVar22 = 0; plVar7 = plStack_48, uVar22 < plVar10->padding[1]; uVar22 = uVar22 + 1) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_typedef(plVar6,iVar9,plVar10->module,(lys_tpdf *)(plVar10[1].ref + lVar24));
        lVar24 = lVar24 + 0x80;
      }
      pplVar20 = &plVar10->child;
      pplVar13 = pplVar20;
      while (plVar6 = plStack_48, plVar11 = *pplVar13, plVar11 != (lys_node *)0x0) {
        if (plVar11->parent == plVar10) {
          yin_print_close_parent(plVar7,(int *)((long)&inout + 4));
          yin_print_snode(plVar7,iVar9,plVar11,0x800);
          plVar10 = local_40;
        }
        pplVar13 = &plVar11->next;
      }
      pplVar13 = pplVar20;
      while (plVar7 = plStack_48, plVar11 = *pplVar13, plVar11 != (lys_node *)0x0) {
        if (plVar11->parent == plVar10) {
          yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
          yin_print_snode(plVar6,iVar9,plVar11,0x903f);
          plVar10 = local_40;
        }
        pplVar13 = &plVar11->next;
      }
      pplVar13 = pplVar20;
      while (out = plStack_48, plVar11 = *pplVar13, plVar11 != (lys_node *)0x0) {
        if (plVar11->parent == plVar10) {
          yin_print_close_parent(plVar7,(int *)((long)&inout + 4));
          yin_print_snode(plVar7,iVar9,plVar11,0x4000);
          plVar10 = local_40;
        }
        pplVar13 = &plVar11->next;
      }
      while (plVar11 = *pplVar20, plVar11 != (lys_node *)0x0) {
        if (plVar11->parent == plVar10) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,iVar9,plVar11,0x80);
          plVar10 = local_40;
        }
        pplVar20 = &plVar11->next;
      }
      pcVar17 = "list";
      iVar9 = inout._4_4_;
    }
    else if (LVar16 == LYS_ANYXML) {
LAB_0018385e:
      inout._4_4_ = 0;
      plVar10 = lys_parent(node);
      pcVar19 = local_40->name;
      if (((plVar10 == (lys_node *)0x0) && (iVar9 = strcmp(pcVar19,"config"), iVar9 == 0)) &&
         (iVar9 = strcmp(local_40->module->name,"ietf-netconf"), iVar9 == 0)) {
        return;
      }
      plVar10 = local_40;
      pcVar17 = "anydata";
      if (local_40->nodetype == LYS_ANYXML) {
        pcVar17 = "anyxml";
      }
      yin_print_open(out,level,(char *)0x0,pcVar17,"name",pcVar19,0);
      iVar9 = level + 1;
      yin_print_snode_common(out,iVar9,plVar10,plVar10->module,(int *)((long)&inout + 4),1);
      if (plVar10[1].name != (char *)0x0) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_when(out,iVar9,plVar10->module,(lys_when *)plVar10[1].name);
      }
      plVar6 = plStack_48;
      lVar24 = 0;
      for (uVar22 = 0; plVar7 = plStack_48, uVar22 < plVar10->iffeature_size; uVar22 = uVar22 + 1) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_iffeature(plVar6,iVar9,plVar10->module,
                            (lys_iffeature *)((long)&plVar10->iffeature->expr + lVar24));
        lVar24 = lVar24 + 0x20;
      }
      lVar24 = 0;
      for (uVar22 = 0; out = plStack_48, uVar22 < plVar10->padding[3]; uVar22 = uVar22 + 1) {
        yin_print_close_parent(plVar7,(int *)((long)&inout + 4));
        yin_print_must(plVar7,iVar9,local_40->module,(lys_restr *)(local_40[1].dsc + lVar24));
        lVar24 = lVar24 + 0x38;
        plVar10 = local_40;
      }
      yin_print_snode_common
                (plStack_48,iVar9,plVar10,plVar10->module,(int *)((long)&inout + 4),0x7c);
      iVar9 = inout._4_4_;
    }
    else if (LVar16 == LYS_CASE) {
      inout._4_4_ = 0;
      if ((node->flags & 0x40) == 0) {
        yin_print_open(out,level,(char *)0x0,"case","name",node->name,0);
        level = level + 1;
        yin_print_snode_common(out,level,local_40,local_40->module,(int *)((long)&inout + 4),1);
        lVar24._0_1_ = local_40->hash[0];
        lVar24._1_1_ = local_40->hash[1];
        lVar24._2_1_ = local_40->hash[2];
        lVar24._3_1_ = local_40->hash[3];
        lVar24._4_4_ = *(undefined4 *)&local_40->field_0x6c;
        if (lVar24 != 0) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_when(out,level,local_40->module,*(lys_when **)local_40->hash);
        }
        yin_print_snode_common(out,level,local_40,local_40->module,(int *)((long)&inout + 4),0x72);
      }
      else {
        inout._4_4_ = 1;
      }
      pplVar20 = &local_40->child;
      plVar10 = local_40;
      while (plVar11 = *pplVar20, plVar11 != (lys_node *)0x0) {
        if (plVar11->parent == plVar10) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,level,plVar11,0x903f);
          plVar10 = local_40;
        }
        pplVar20 = &plVar11->next;
      }
      if ((plVar10->flags & 0x40) != 0) {
        return;
      }
      level = level + -1;
      pcVar17 = "case";
      iVar9 = inout._4_4_;
    }
    else if (LVar16 == LYS_NOTIF) {
      inout._4_4_ = 0;
      lVar24 = 0;
      yin_print_open(out,level,(char *)0x0,"notification","name",node->name,0);
      iVar9 = level + 1;
      yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),3);
      for (uVar22 = 0; uVar22 < node->padding[1]; uVar22 = uVar22 + 1) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_must(out,iVar9,node->module,(lys_restr *)(node[1].dsc + lVar24));
        lVar24 = lVar24 + 0x38;
      }
      yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),0x70);
      lVar24 = 0;
      for (uVar22 = 0; plVar6 = plStack_48, uVar22 < *(ushort *)(node->padding + 2);
          uVar22 = uVar22 + 1) {
        yin_print_close_parent(out,(int *)((long)&inout + 4));
        yin_print_typedef(out,iVar9,node->module,(lys_tpdf *)(node[1].name + lVar24));
        lVar24 = lVar24 + 0x80;
      }
      pplVar20 = &node->child;
      pplVar13 = pplVar20;
      while (out = plStack_48, plVar10 = *pplVar13, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == node) {
          yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
          yin_print_snode(plVar6,iVar9,plVar10,0x800);
          node = local_40;
        }
        pplVar13 = &plVar10->next;
      }
      while (plVar10 = *pplVar20, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == node) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,iVar9,plVar10,0x903f);
          node = local_40;
        }
        pplVar20 = &plVar10->next;
      }
      pcVar17 = "notification";
      iVar9 = inout._4_4_;
    }
    else if (LVar16 == LYS_RPC) {
LAB_00183a3d:
      inout._4_4_ = 0;
      pcVar17 = "action";
      if (LVar1 == LYS_RPC) {
        pcVar17 = "rpc";
      }
      lVar24 = 0;
      yin_print_open(out,level,(char *)0x0,pcVar17,"name",node->name,0);
      iVar9 = level + 1;
      yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),0x73);
      plVar6 = plStack_48;
      for (uVar22 = 0; plVar7 = plStack_48, uVar22 < *(ushort *)(node->padding + 2);
          uVar22 = uVar22 + 1) {
        yin_print_close_parent(plVar6,(int *)((long)&inout + 4));
        yin_print_typedef(plVar6,iVar9,node->module,(lys_tpdf *)(node[1].name + lVar24));
        lVar24 = lVar24 + 0x80;
      }
      pplVar20 = &node->child;
      while (plVar10 = *pplVar20, plVar10 != (lys_node *)0x0) {
        if ((plVar10->parent == node) &&
           (((plVar10->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
            ((plVar10->flags & 0x40) == 0)))) {
          yin_print_close_parent(plVar7,(int *)((long)&inout + 4));
          yin_print_snode(plVar7,iVar9,plVar10,0xe00);
          node = local_40;
        }
        pplVar20 = &plVar10->next;
      }
      pcVar17 = "action";
      out = plStack_48;
      iVar9 = inout._4_4_;
      if (node->nodetype == LYS_RPC) {
        pcVar17 = "rpc";
      }
    }
    else {
      if ((LVar16 == LYS_INPUT) || (LVar16 == LYS_OUTPUT)) {
        pcVar19 = "output";
        pcVar17 = "output";
        if (LVar1 == LYS_INPUT) {
          pcVar17 = "input";
        }
        yin_print_open(out,level,(char *)0x0,pcVar17,(char *)0x0,(char *)0x0,1);
        iVar9 = level + 1;
        if (local_40->ext_size != 0) {
          yin_print_extension_instances
                    (out,iVar9,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                     (uint)local_40->ext_size);
        }
        lVar24 = 0;
        for (uVar22 = 0; uVar22 < local_40->padding[1]; uVar22 = uVar22 + 1) {
          yin_print_must(plStack_48,iVar9,local_40->module,(lys_restr *)(local_40[1].name + lVar24))
          ;
          lVar24 = lVar24 + 0x38;
        }
        lVar24 = 0;
        for (uVar22 = 0; uVar22 < *(ushort *)(local_40->padding + 2); uVar22 = uVar22 + 1) {
          yin_print_typedef(plStack_48,iVar9,local_40->module,
                            (lys_tpdf *)(*(long *)local_40->hash + lVar24));
          lVar24 = lVar24 + 0x80;
        }
        pplVar20 = &local_40->child;
        plVar10 = local_40;
        pplVar13 = pplVar20;
        while (out = plStack_48, plVar11 = *pplVar13, plVar11 != (lys_node *)0x0) {
          if (plVar11->parent == plVar10) {
            yin_print_snode(plStack_48,iVar9,plVar11,0x800);
            plVar10 = local_40;
          }
          pplVar13 = &plVar11->next;
        }
        while (plVar11 = *pplVar20, plVar11 != (lys_node *)0x0) {
          if (plVar11->parent == plVar10) {
            yin_print_snode(out,iVar9,plVar11,0x903f);
            plVar10 = local_40;
          }
          pplVar20 = &plVar11->next;
        }
        if (plVar10->nodetype == LYS_INPUT) {
          pcVar19 = "input";
        }
        goto LAB_0018537b;
      }
      if (LVar16 == LYS_GROUPING) {
        inout._4_4_ = 0;
        lVar24 = 0;
        yin_print_open(out,level,(char *)0x0,"grouping","name",node->name,0);
        iVar9 = level + 1;
        yin_print_snode_common(out,iVar9,node,node->module,(int *)((long)&inout + 4),0x71);
        for (uVar22 = 0; uVar22 < *(ushort *)(node->padding + 2); uVar22 = uVar22 + 1) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_typedef(out,iVar9,node->module,(lys_tpdf *)(*(long *)node->hash + lVar24));
          lVar24 = lVar24 + 0x80;
        }
        pplVar13 = &node->child;
        pplVar20 = pplVar13;
        while (plVar10 = *pplVar20, plVar10 != (lys_node *)0x0) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,iVar9,plVar10,0x800);
          pplVar20 = &plVar10->next;
        }
        pplVar20 = pplVar13;
        while (plVar10 = *pplVar20, plVar10 != (lys_node *)0x0) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,iVar9,plVar10,0x903f);
          pplVar20 = &plVar10->next;
        }
        pplVar20 = pplVar13;
        while (plVar10 = *pplVar20, plVar10 != (lys_node *)0x0) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,iVar9,plVar10,0x4000);
          pplVar20 = &plVar10->next;
        }
        while (plVar10 = *pplVar13, plVar10 != (lys_node *)0x0) {
          yin_print_close_parent(out,(int *)((long)&inout + 4));
          yin_print_snode(out,iVar9,plVar10,0x80);
          pplVar13 = &plVar10->next;
        }
        pcVar17 = "grouping";
        iVar9 = inout._4_4_;
      }
      else {
        if (LVar16 != LYS_USES) {
          if (LVar16 != LYS_ACTION) {
            if (LVar16 != LYS_ANYDATA) {
              return;
            }
            goto LAB_0018385e;
          }
          goto LAB_00183a3d;
        }
        local_4c = 0;
        ly_print(out,"%*s<uses name=\"",(ulong)(uint)(level * 2),"");
        if (local_40->child != (lys_node *)0x0) {
          plVar14 = lys_node_module(local_40->child);
          plVar15 = lys_node_module(local_40);
          if (plVar15 != plVar14) {
            pcVar17 = transform_module_name2import_prefix(local_40->module,plVar14->name);
            ly_print(out,"%s:",pcVar17);
          }
        }
        ly_print(out,"%s\"",local_40->name);
        iVar9 = level + 1;
        yin_print_snode_common(out,iVar9,local_40,local_40->module,&local_4c,1);
        lVar5._0_1_ = local_40->hash[0];
        lVar5._1_1_ = local_40->hash[1];
        lVar5._2_1_ = local_40->hash[2];
        lVar5._3_1_ = local_40->hash[3];
        lVar5._4_4_ = *(undefined4 *)&local_40->field_0x6c;
        if (lVar5 != 0) {
          yin_print_close_parent(out,&local_4c);
          yin_print_when(out,iVar9,local_40->module,*(lys_when **)local_40->hash);
        }
        yin_print_snode_common(out,iVar9,local_40,local_40->module,&local_4c,0x72);
        iVar18 = level + 2;
        for (uVar22 = 0; plVar10 = local_40, uVar22 < local_40->padding[2]; uVar22 = uVar22 + 1) {
          yin_print_close_parent(out,&local_4c);
          plVar14 = plVar10->module;
          pcVar17 = plVar10[1].name;
          plVar10 = (lys_node *)(pcVar17 + uVar22 * 0x50);
          inout._4_4_ = 0;
          pcVar17 = transform_json2xml(plVar14,*(char **)(pcVar17 + uVar22 * 0x50),0,(char ***)0x0,
                                       (char ***)0x0,(uint32_t *)0x0);
          yin_print_open(out,iVar9,(char *)0x0,"refine","target-node",pcVar17,inout._4_4_);
          lydict_remove(plVar14->ctx,pcVar17);
          par_close_flag = (int *)((long)&inout + 4);
          yin_print_snode_common(out,iVar18,plVar10,plVar14,par_close_flag,3);
          lVar24 = 0;
          for (uVar23 = 0; out = plStack_48, uVar23 < plVar10->padding[2]; uVar23 = uVar23 + 1) {
            yin_print_close_parent(plStack_48,par_close_flag);
            yin_print_must(out,iVar18,plVar14,(lys_restr *)(*(long *)&plVar10->nodetype + lVar24));
            lVar24 = lVar24 + 0x38;
          }
          if ((*(short *)plVar10->padding == 1) && (plVar10->child != (lys_node *)0x0)) {
            yin_print_close_parent(plStack_48,par_close_flag);
            yin_print_substmt(out,iVar18,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar10->child,plVar14,
                              plVar10->ext,(uint)plVar10->ext_size);
          }
          for (uVar23 = 0; uVar23 < plVar10->padding[3]; uVar23 = uVar23 + 1) {
            yin_print_close_parent(out,par_close_flag);
            yin_print_substmt(out,iVar18,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar23,
                              *(char **)(plVar10->parent->padding + uVar23 * 8 + -0x1c),plVar14,
                              plVar10->ext,(uint)plVar10->ext_size);
          }
          pcVar17 = "true";
          if (((plVar10->flags & 1) != 0) || (pcVar17 = "false", (plVar10->flags & 2) != 0)) {
            yin_print_close_parent(out,par_close_flag);
            yin_print_substmt(out,iVar18,LYEXT_SUBSTMT_CONFIG,'\0',pcVar17,plVar14,plVar10->ext,
                              (uint)plVar10->ext_size);
          }
          pcVar17 = "true";
          if (((plVar10->flags & 0x40) != 0) || (pcVar17 = "false", (char)plVar10->flags < '\0')) {
            yin_print_close_parent(out,par_close_flag);
            yin_print_substmt(out,iVar18,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar17,plVar14,plVar10->ext,
                              (uint)plVar10->ext_size);
          }
          if ((plVar10->padding[0] & 0x18) != 0) {
            uVar8 = plVar10->flags;
            if ((uVar8 & 0x10) != 0) {
              yin_print_close_parent(out,par_close_flag);
              yin_print_unsigned(out,iVar18,LYEXT_SUBSTMT_MIN,'\0',plVar14,plVar10->ext,
                                 (uint)plVar10->ext_size,*(uint *)&plVar10->child);
              uVar8 = plVar10->flags;
            }
            if ((uVar8 & 8) != 0) {
              yin_print_close_parent(out,par_close_flag);
              uVar2 = *(uint *)((long)&plVar10->child + 4);
              if (uVar2 == 0) {
                yin_print_substmt(out,iVar18,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar14,plVar10->ext
                                  ,(uint)plVar10->ext_size);
              }
              else {
                yin_print_unsigned(out,iVar18,LYEXT_SUBSTMT_MAX,'\0',plVar14,plVar10->ext,
                                   (uint)plVar10->ext_size,uVar2);
              }
            }
          }
          yin_print_snode_common(out,iVar18,plVar10,plVar14,par_close_flag,0x60);
          yin_print_close(out,iVar9,(char *)0x0,"refine",inout._4_4_);
        }
        lVar24 = 0;
        for (uVar22 = 0; uVar22 < local_40->padding[3]; uVar22 = uVar22 + 1) {
          yin_print_close_parent(out,&local_4c);
          yin_print_augment(out,iVar9,local_40->module,
                            (lys_node_augment *)(local_40[1].dsc + lVar24));
          lVar24 = lVar24 + 0x68;
        }
        pcVar17 = "uses";
        iVar9 = local_4c;
      }
    }
  }
  yin_print_close(out,level,(char *)0x0,pcVar17,iVar9);
switchD_00183988_caseD_3:
  return;
}

Assistant:

static void
yin_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yin_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yin_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yin_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yin_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yin_print_list(out, level, node);
        break;
    case LYS_USES:
        yin_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yin_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yin_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yin_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yin_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yin_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yin_print_notif(out, level, node);
        break;
    default:
        break;
    }
}